

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

Vec2 __thiscall
tcu::computeVulkanLodBoundsFromDerivates
          (tcu *this,float dudx,float dvdx,float dwdx,float dudy,float dvdy,float dwdy,
          LodPrecision *prec)

{
  uint uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 extraout_var [12];
  
  uVar1 = -(uint)(-dudx <= dudx);
  fVar4 = (float)((uint)dudx & uVar1 | ~uVar1 & (uint)-dudx);
  uVar1 = -(uint)(-dvdx <= dvdx);
  fVar11 = (float)(uVar1 & (uint)dvdx | ~uVar1 & (uint)-dvdx);
  uVar1 = -(uint)(-dwdx <= dwdx);
  fVar9 = (float)(uVar1 & (uint)dwdx | ~uVar1 & (uint)-dwdx);
  uVar1 = -(uint)(-dudy <= dudy);
  fVar5 = (float)(uVar1 & (uint)dudy | ~uVar1 & (uint)-dudy);
  uVar1 = -(uint)(-dvdy <= dvdy);
  fVar2 = (float)(uVar1 & (uint)dvdy | ~uVar1 & (uint)-dvdy);
  uVar1 = -(uint)(-dwdy <= dwdy);
  fVar6 = (float)(uVar1 & (uint)dwdy | ~uVar1 & (uint)-dwdy);
  fVar7 = (float)(~-(uint)(fVar11 <= fVar4) & (uint)fVar11 | -(uint)(fVar11 <= fVar4) & (uint)fVar4)
  ;
  uVar1 = -(uint)(fVar9 <= fVar7);
  fVar7 = (float)(~uVar1 & (uint)fVar9 | uVar1 & (uint)fVar7);
  fVar8 = (float)(~-(uint)(fVar2 <= fVar5) & (uint)fVar2 | -(uint)(fVar2 <= fVar5) & (uint)fVar5);
  uVar1 = -(uint)(fVar6 <= fVar8);
  fVar10 = (float)(~uVar1 & (uint)fVar6 | uVar1 & (uint)fVar8);
  fVar8 = (fVar4 + fVar11 + fVar9) * 1.4142135;
  fVar4 = (fVar2 + fVar5 + fVar6) * 1.4142135;
  uVar1 = -(uint)(fVar10 <= fVar7);
  fVar5 = (float)(~uVar1 & (uint)fVar10 | uVar1 & (uint)fVar7);
  uVar1 = -(uint)(fVar4 <= fVar8);
  fVar6 = (float)((uint)fVar8 & uVar1 | ~uVar1 & (uint)fVar4);
  fVar4 = TexVerifierUtil::computeFloatingPointError(fVar5,prec->derivateBits);
  fVar2 = TexVerifierUtil::computeFloatingPointError(fVar6,prec->derivateBits);
  fVar4 = logf(fVar5 - fVar4);
  fVar2 = logf(fVar2 + fVar6);
  auVar3._0_4_ = TexVerifierUtil::computeFixedPointError(prec->lodBits);
  auVar3._4_12_ = extraout_var;
  *(float *)this = fVar4 * 1.442695 - auVar3._0_4_;
  *(float *)(this + 4) = fVar2 * 1.442695 + auVar3._0_4_;
  return (Vec2)auVar3._0_8_;
}

Assistant:

Vec2 computeVulkanLodBoundsFromDerivates (const float dudx, const float dvdx, const float dwdx, const float dudy, const float dvdy, const float dwdy, const LodPrecision& prec)
{
	const float		mux			= deFloatAbs(dudx);
	const float		mvx			= deFloatAbs(dvdx);
	const float		mwx			= deFloatAbs(dwdx);
	const float		muy			= deFloatAbs(dudy);
	const float		mvy			= deFloatAbs(dvdy);
	const float		mwy			= deFloatAbs(dwdy);

	// Ideal:
	// px = deFloatSqrt2(mux*mux + mvx*mvx + mwx*mwx);
	// py = deFloatSqrt2(muy*muy + mvy*mvy + mwy*mwy);

	// fx, fy estimate lower bounds
	const float		fxMin		= de::max(de::max(mux, mvx), mwx);
	const float		fyMin		= de::max(de::max(muy, mvy), mwy);

	// fx, fy estimate upper bounds
	const float		sqrt2		= deFloatSqrt(2.0f);
	const float		fxMax		= sqrt2 * (mux + mvx + mwx);
	const float		fyMax		= sqrt2 * (muy + mvy + mwy);

	// p = max(px, py) (isotropic filtering)
	const float		pMin		= de::max(fxMin, fyMin);
	const float		pMax		= de::max(fxMax, fyMax);

	// error terms
	const float		pMinErr		= computeFloatingPointError(pMin, prec.derivateBits);
	const float		pMaxErr		= computeFloatingPointError(pMax, prec.derivateBits);

	const float		minLod		= deFloatLog2(pMin-pMinErr);
	const float		maxLod		= deFloatLog2(pMax+pMaxErr);
	const float		lodErr		= computeFixedPointError(prec.lodBits);

	DE_ASSERT(minLod <= maxLod);
	return Vec2(minLod-lodErr, maxLod+lodErr);
}